

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_acid_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  int hpch;
  int dice_dam;
  int hp_dam;
  int dam;
  CHAR_DATA *victim;
  int in_stack_00000044;
  int in_stack_00000048;
  int in_stack_0000004c;
  void *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar2;
  
  pCVar2 = in_RCX;
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  dice(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  bVar1 = saves_spell((int)victim,_hp_dam,dice_dam);
  if (bVar1) {
    acid_effect(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044);
    damage_old((CHAR_DATA *)CONCAT44(dice_dam,hpch),(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),
               (int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)pCVar2 >> 0x20),
               SUB81((ulong)pCVar2 >> 0x18,0));
  }
  else {
    acid_effect(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044);
    damage_old((CHAR_DATA *)CONCAT44(dice_dam,hpch),(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),
               (int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)pCVar2 >> 0x20),
               SUB81((ulong)pCVar2 >> 0x18,0));
  }
  return;
}

Assistant:

void spell_acid_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam, hp_dam, dice_dam, hpch;

	act("$n spits acid at $N.", ch, nullptr, victim, TO_NOTVICT);
	act("$n spits a stream of corrosive acid at you.", ch, nullptr, victim, TO_VICT);
	act("You spit acid at $N.", ch, nullptr, victim, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 4);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = 0;

	/*
	hpch = std::max(12,ch->hit);
	hp_dam = number_range(hpch/11 + 1, hpch/6);
	dice_dam = dice(level,16);

	dam = std::max(hp_dam + dice_dam/10,dice_dam + hp_dam/10);
	*/

	if (saves_spell(level, victim, DAM_ACID))
	{
		acid_effect(victim, level / 2, dam / 4, TARGET_CHAR);
		damage_old(ch, victim, dam / 2, sn, DAM_ACID, true);
	}
	else
	{
		acid_effect(victim, level, dam, TARGET_CHAR);
		damage_old(ch, victim, dam, sn, DAM_ACID, true);
	}
}